

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::TimeRange::setTimeInterval(TimeRange *this,double init,double end)

{
  double *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  
  if (in_XMM0_Qa <= in_XMM1_Qa) {
    *in_RDI = in_XMM0_Qa;
    in_RDI[1] = in_XMM1_Qa;
    *(undefined1 *)(in_RDI + 2) = 0;
  }
  else {
    iDynTree::reportError
              ("TimeRange","setTimeInterval","The init time should be grater than the end.");
  }
  return in_XMM0_Qa <= in_XMM1_Qa;
}

Assistant:

bool TimeRange::setTimeInterval(const double init, const double end)
        {
            if(init > end){
                reportError("TimeRange", "setTimeInterval", "The init time should be grater than the end.");
                return false;
            }

            m_initTime = init;
            m_endTime = end;
            m_anyTime = false;

            return true;
        }